

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_carith.c
# Opt level: O0

uint64_t lj_carith_powu64(uint64_t x,uint64_t k)

{
  uint64_t y;
  uint64_t k_local;
  uint64_t x_local;
  undefined8 local_8;
  
  k_local = k;
  x_local = x;
  if (k == 0) {
    local_8 = 1;
  }
  else {
    for (; (k_local & 1) == 0; k_local = k_local >> 1) {
      x_local = x_local * x_local;
    }
    y = x_local;
    k_local = k_local >> 1;
    if (k_local != 0) {
      for (; x_local = x_local * x_local, k_local != 1; k_local = k_local >> 1) {
        if ((k_local & 1) != 0) {
          y = x_local * y;
        }
      }
      y = x_local * y;
    }
    local_8 = y;
  }
  return local_8;
}

Assistant:

uint64_t lj_carith_powu64(uint64_t x, uint64_t k)
{
  uint64_t y;
  if (k == 0)
    return 1;
  for (; (k & 1) == 0; k >>= 1) x *= x;
  y = x;
  if ((k >>= 1) != 0) {
    for (;;) {
      x *= x;
      if (k == 1) break;
      if (k & 1) y *= x;
      k >>= 1;
    }
    y *= x;
  }
  return y;
}